

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O3

VP8StatusCode VP8EnterCritical(VP8Decoder *dec,VP8Io *io)

{
  VP8FInfo *pVVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint8_t uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int s;
  long lVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  
  if ((io->setup != (VP8IoSetupHook)0x0) && (iVar5 = (*io->setup)(io), iVar5 == 0)) {
    VP8SetError(dec,VP8_STATUS_USER_ABORT,"Frame setup failed");
    return dec->status;
  }
  if (io->bypass_filtering == 0) {
    iVar5 = dec->filter_type;
    uVar12 = (uint)""[iVar5];
    if ((long)iVar5 != 2) goto LAB_0012e76a;
    dec->tl_mb_x = 0;
    iVar5 = 2;
  }
  else {
    dec->filter_type = 0;
    uVar12 = 0;
    iVar5 = 0;
LAB_0012e76a:
    iVar10 = (int)(io->crop_left - uVar12) >> 4;
    dec->tl_mb_x = iVar10;
    iVar8 = (int)(io->crop_top - uVar12) >> 4;
    dec->tl_mb_y = iVar8;
    if (iVar10 < 0) {
      dec->tl_mb_x = 0;
    }
    if (-1 < iVar8) goto LAB_0012e7aa;
  }
  dec->tl_mb_y = 0;
LAB_0012e7aa:
  iVar10 = (int)(io->crop_bottom + uVar12 + 0xf) >> 4;
  dec->br_mb_y = iVar10;
  iVar8 = (int)(uVar12 + 0xf + io->crop_right) >> 4;
  if (dec->mb_w <= iVar8) {
    iVar8 = dec->mb_w;
  }
  dec->br_mb_x = iVar8;
  if (dec->mb_h < iVar10) {
    dec->br_mb_y = dec->mb_h;
  }
  if (0 < iVar5) {
    iVar5 = (dec->filter_hdr).use_lf_delta;
    iVar8 = (dec->segment_hdr).use_segment;
    lVar11 = 0;
    do {
      if (iVar8 == 0) {
        uVar12 = (dec->filter_hdr).level;
      }
      else {
        uVar12 = (uint)(dec->segment_hdr).filter_strength[lVar11];
        if ((dec->segment_hdr).absolute_delta == 0) {
          uVar12 = uVar12 + (dec->filter_hdr).level;
        }
      }
      lVar14 = 0;
      bVar4 = true;
      do {
        bVar3 = bVar4;
        uVar6 = uVar12;
        if ((iVar5 != 0) && (uVar6 = (dec->filter_hdr).ref_lf_delta[0] + uVar12, !bVar3)) {
          uVar6 = uVar6 + (dec->filter_hdr).mode_lf_delta[0];
        }
        uVar13 = 0x3f;
        if ((int)uVar6 < 0x3f) {
          uVar13 = uVar6;
        }
        if ((int)uVar13 < 1) {
          uVar13 = 0;
        }
        pVVar1 = dec->fstrengths[lVar11] + lVar14;
        if ((int)uVar6 < 1) {
          pVVar1->f_limit = '\0';
        }
        else {
          uVar2 = (dec->filter_hdr).sharpness;
          uVar9 = uVar13;
          if (0 < (int)uVar2) {
            uVar9 = uVar13 >> (2U - (uVar2 < 5) & 0x1f);
            if ((int)(9 - uVar2) <= (int)uVar9) {
              uVar9 = 9 - uVar2;
            }
          }
          if ((int)uVar9 < 2) {
            uVar9 = 1;
          }
          pVVar1->f_ilevel = (uint8_t)uVar9;
          pVVar1->f_limit = (uint8_t)uVar9 + (char)uVar13 * '\x02';
          uVar7 = 0xe < uVar6;
          if (0x27 < uVar6) {
            uVar7 = '\x02';
          }
          pVVar1->hev_thresh = uVar7;
        }
        pVVar1->f_inner = (uint8_t)lVar14;
        lVar14 = 1;
        bVar4 = false;
      } while (bVar3);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
  }
  return VP8_STATUS_OK;
}

Assistant:

VP8StatusCode VP8EnterCritical(VP8Decoder* const dec, VP8Io* const io) {
  // Call setup() first. This may trigger additional decoding features on 'io'.
  // Note: Afterward, we must call teardown() no matter what.
  if (io->setup != NULL && !io->setup(io)) {
    VP8SetError(dec, VP8_STATUS_USER_ABORT, "Frame setup failed");
    return dec->status;
  }

  // Disable filtering per user request
  if (io->bypass_filtering) {
    dec->filter_type = 0;
  }

  // Define the area where we can skip in-loop filtering, in case of cropping.
  //
  // 'Simple' filter reads two luma samples outside of the macroblock
  // and filters one. It doesn't filter the chroma samples. Hence, we can
  // avoid doing the in-loop filtering before crop_top/crop_left position.
  // For the 'Complex' filter, 3 samples are read and up to 3 are filtered.
  // Means: there's a dependency chain that goes all the way up to the
  // top-left corner of the picture (MB #0). We must filter all the previous
  // macroblocks.
  {
    const int extra_pixels = kFilterExtraRows[dec->filter_type];
    if (dec->filter_type == 2) {
      // For complex filter, we need to preserve the dependency chain.
      dec->tl_mb_x = 0;
      dec->tl_mb_y = 0;
    } else {
      // For simple filter, we can filter only the cropped region.
      // We include 'extra_pixels' on the other side of the boundary, since
      // vertical or horizontal filtering of the previous macroblock can
      // modify some abutting pixels.
      dec->tl_mb_x = (io->crop_left - extra_pixels) >> 4;
      dec->tl_mb_y = (io->crop_top - extra_pixels) >> 4;
      if (dec->tl_mb_x < 0) dec->tl_mb_x = 0;
      if (dec->tl_mb_y < 0) dec->tl_mb_y = 0;
    }
    // We need some 'extra' pixels on the right/bottom.
    dec->br_mb_y = (io->crop_bottom + 15 + extra_pixels) >> 4;
    dec->br_mb_x = (io->crop_right + 15 + extra_pixels) >> 4;
    if (dec->br_mb_x > dec->mb_w) {
      dec->br_mb_x = dec->mb_w;
    }
    if (dec->br_mb_y > dec->mb_h) {
      dec->br_mb_y = dec->mb_h;
    }
  }
  PrecomputeFilterStrengths(dec);
  return VP8_STATUS_OK;
}